

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::SENode::AsString_abi_cxx11_(string *__return_storage_ptr__,SENode *this)

{
  int iVar1;
  allocator<char> local_20;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d;
  allocator<char> local_1c;
  allocator<char> local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  SENode *local_18;
  SENode *this_local;
  
  local_18 = this;
  this_local = (SENode *)__return_storage_ptr__;
  iVar1 = (**this->_vptr_SENode)();
  switch(iVar1) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Constant",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"RecurrentAddExpr",&local_1a);
    std::allocator<char>::~allocator(&local_1a);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Add",&local_1b);
    std::allocator<char>::~allocator(&local_1b);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Multiply",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Negative",&local_1c);
    std::allocator<char>::~allocator(&local_1c);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Value Unknown",&local_1e);
    std::allocator<char>::~allocator(&local_1e);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Can not compute",&local_1f);
    std::allocator<char>::~allocator(&local_1f);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NULL",&local_20);
    std::allocator<char>::~allocator(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SENode::AsString() const {
  switch (GetType()) {
    case Constant:
      return "Constant";
    case RecurrentAddExpr:
      return "RecurrentAddExpr";
    case Add:
      return "Add";
    case Negative:
      return "Negative";
    case Multiply:
      return "Multiply";
    case ValueUnknown:
      return "Value Unknown";
    case CanNotCompute:
      return "Can not compute";
  }
  return "NULL";
}